

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool isItRandom<CyclicHash<unsigned_long_long,unsigned_char>>(uint L)

{
  int k;
  ostream *poVar1;
  long lVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  uint uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  CyclicHash<unsigned_long_long,_unsigned_char> base;
  CyclicHash<unsigned_long_long,_unsigned_char> hf;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"checking that it is randomized ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,5,(allocator_type *)&base);
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] = (uchar)lVar2;
  }
  CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash(&base,5,L);
  uVar3 = CyclicHash<unsigned_long_long,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((CyclicHash<unsigned_long_long,unsigned_char> *)&base,&data);
  uVar5 = 0;
  do {
    if (uVar5 == 100) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Not randomized! ");
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_00104696:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return uVar5 < 100;
    }
    CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash(&hf,5,L);
    uVar4 = CyclicHash<unsigned_long_long,unsigned_char>::
            hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_long_long,unsigned_char> *)&hf,&data);
    if (uVar4 != uVar3) {
      poVar1 = std::operator<<((ostream *)&std::cout,"It is randomized! ");
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_00104696;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"collision ");
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}